

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::modbaseappr(BN *this,bt *diviser)

{
  ushort uVar1;
  pointer puVar2;
  divide_by_zero *this_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = *diviser;
  if (uVar1 != 0) {
    puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 1;
    uVar3 = 0;
    uVar5 = uVar4;
    while (uVar5 = uVar5 - 1, uVar5 < uVar4) {
      uVar3 = (uint)puVar2[uVar5] | uVar3 << 0x10;
      puVar2[uVar5] = (unsigned_short)(uVar3 / uVar1);
      uVar1 = *diviser;
      uVar3 = uVar3 % (uint)uVar1;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,1);
    *(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
     super__Vector_impl_data._M_start = (unsigned_short)uVar3;
    return this;
  }
  this_00 = (divide_by_zero *)__cxa_allocate_exception(0x10);
  divide_by_zero::divide_by_zero(this_00);
  __cxa_throw(this_00,&divide_by_zero::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BN& BN::modbaseappr(const bt &diviser)
{
    if(diviser == 0)
        throw divide_by_zero();
    bt2 curr = 0;
    for(size_t i = ba.size() - 1; i < ba.size(); --i) {
        curr <<= bz8;
        curr += ba[i];
        ba[i] = curr / diviser;
        curr %= diviser;
    }
    ba.resize(1);
    ba[0] = curr;
    return *this;
}